

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

int Wlc_ObjCheckIsEmpty_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t WVar1;
  uint uVar2;
  int iVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar4;
  ulong uVar5;
  long lVar6;
  
  WVar1 = *pObj;
  uVar2 = 1;
  if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) != (undefined1  [24])0x0)
  {
    if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x1) {
      uVar2 = (int)((long)pObj - (long)p->pObjs >> 3) * -0x55555555;
      if (((int)uVar2 < 0) || ((p->vRefs).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = (uint)((p->vRefs).pArray[uVar2 & 0x7fffffff] == 0);
    }
    else if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3d) ==
             (undefined1  [24])0x1) {
LAB_0035d2c7:
      uVar2 = 0;
    }
    else {
      uVar5 = (ulong)pObj->nFanins;
      if (0 < (int)pObj->nFanins) {
        lVar6 = 0;
        do {
          if ((2 < (uint)uVar5) ||
             (paVar4 = &pObj->field_10,
             (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
          }
          iVar3 = paVar4->Fanins[lVar6];
          if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          iVar3 = Wlc_ObjCheckIsEmpty_rec(p,p->pObjs + iVar3);
          if (iVar3 == 0) goto LAB_0035d2c7;
          lVar6 = lVar6 + 1;
          uVar5 = (ulong)(int)pObj->nFanins;
        } while (lVar6 < (long)uVar5);
      }
    }
  }
  return uVar2;
}

Assistant:

int Wlc_ObjCheckIsEmpty_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    int k, iFanin;
    if ( Wlc_ObjType(pObj) == 0 )
        return 1;
    if ( Wlc_ObjIsPi(pObj) )
        return Vec_IntEntry(&p->vRefs, Wlc_ObjId(p, pObj)) == 0;
    else if ( Wlc_ObjIsCi(pObj) )
        return 0;
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        if ( !Wlc_ObjCheckIsEmpty_rec(p, Wlc_NtkObj(p, iFanin)) )
            return 0;
    return 1;
}